

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ObjFileMtlImporter.cpp
# Opt level: O1

void __thiscall Assimp::ObjFileMtlImporter::createMaterial(ObjFileMtlImporter *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  mapped_type pMVar2;
  Model *pMVar3;
  uint uVar4;
  ulong uVar5;
  long lVar6;
  iterator iVar7;
  Material *pMVar8;
  mapped_type *ppMVar9;
  string name;
  string line;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  token;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_88;
  undefined1 *local_70 [2];
  undefined1 local_60 [16];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  local_a8._M_dataplus._M_p = (pointer)&local_a8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_a8,"");
  while ((uVar4 = (uint)(byte)*(this->m_DataIt)._M_current, 0xd < uVar4 ||
         ((0x3401U >> (uVar4 & 0x1f) & 1) == 0))) {
    std::__cxx11::string::push_back((char)&local_a8);
    (this->m_DataIt)._M_current = (this->m_DataIt)._M_current + 1;
  }
  local_88.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_88.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_88.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  paVar1 = &local_c8.field_2;
  local_c8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_c8," \t","");
  uVar4 = tokenize<std::__cxx11::string>(&local_a8,&local_88,&local_c8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c8._M_dataplus._M_p != paVar1) {
    operator_delete(local_c8._M_dataplus._M_p);
  }
  local_c8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>();
  if (uVar4 == 1) {
    std::__cxx11::string::_M_replace((ulong)&local_c8,0,(char *)local_c8._M_string_length,0x76ce99);
  }
  else {
    uVar5 = std::__cxx11::string::find_first_of((char *)&local_a8,0x7899b4,0);
    lVar6 = std::__cxx11::string::find_first_not_of((char *)&local_a8,0x7899b4,uVar5);
    if (lVar6 != -1) {
      std::__cxx11::string::substr((ulong)local_70,(ulong)&local_a8);
      std::__cxx11::string::operator=((string *)&local_c8,(string *)local_70);
      if (local_70[0] != local_60) {
        operator_delete(local_70[0]);
      }
    }
  }
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_50,local_c8._M_dataplus._M_p,
             (char *)(local_c8._M_string_length + (long)local_c8._M_dataplus._M_p));
  trim_whitespaces<std::__cxx11::string>(&local_50);
  std::__cxx11::string::operator=((string *)&local_c8,(string *)local_70);
  if (local_70[0] != local_60) {
    operator_delete(local_70[0]);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  iVar7 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::ObjFile::Material_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::ObjFile::Material_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::ObjFile::Material_*>_>_>
          ::find(&(this->m_pModel->m_MaterialMap)._M_t,&local_c8);
  if (&(this->m_pModel->m_MaterialMap)._M_t._M_impl.super__Rb_tree_header ==
      (_Rb_tree_header *)iVar7._M_node) {
    pMVar8 = (Material *)operator_new(0x409c);
    ObjFile::Material::Material(pMVar8);
    this->m_pModel->m_pCurrentMaterial = pMVar8;
    if (local_c8._M_string_length < &DAT_00000400) {
      pMVar8 = this->m_pModel->m_pCurrentMaterial;
      (pMVar8->MaterialName).length = (ai_uint32)local_c8._M_string_length;
      memcpy((pMVar8->MaterialName).data,local_c8._M_dataplus._M_p,local_c8._M_string_length);
      (pMVar8->MaterialName).data[local_c8._M_string_length] = '\0';
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(&this->m_pModel->m_MaterialLib,&local_c8);
    pMVar2 = this->m_pModel->m_pCurrentMaterial;
    ppMVar9 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::ObjFile::Material_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::ObjFile::Material_*>_>_>
              ::operator[](&this->m_pModel->m_MaterialMap,&local_c8);
    *ppMVar9 = pMVar2;
    pMVar3 = this->m_pModel;
    if (pMVar3->m_pCurrentMesh != (Mesh *)0x0) {
      pMVar3->m_pCurrentMesh->m_uiMaterialIndex =
           (int)((ulong)((long)(pMVar3->m_MaterialLib).
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_finish -
                        (long)(pMVar3->m_MaterialLib).
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start) >> 5) - 1;
    }
  }
  else {
    this->m_pModel->m_pCurrentMaterial = *(Material **)(iVar7._M_node + 2);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c8._M_dataplus._M_p != paVar1) {
    operator_delete(local_c8._M_dataplus._M_p);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_88);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
    operator_delete(local_a8._M_dataplus._M_p);
  }
  return;
}

Assistant:

void ObjFileMtlImporter::createMaterial()
{
    std::string line( "" );
    while( !IsLineEnd( *m_DataIt ) ) {
        line += *m_DataIt;
        ++m_DataIt;
    }

    std::vector<std::string> token;
    const unsigned int numToken = tokenize<std::string>( line, token, " \t" );
    std::string name( "" );
    if ( numToken == 1 ) {
        name = AI_DEFAULT_MATERIAL_NAME;
    } else {
        // skip newmtl and all following white spaces
        std::size_t first_ws_pos = line.find_first_of(" \t");
        std::size_t first_non_ws_pos = line.find_first_not_of(" \t", first_ws_pos);
        if (first_non_ws_pos != std::string::npos) {
            name = line.substr(first_non_ws_pos);
        }
    }

    name = trim_whitespaces(name);

    std::map<std::string, ObjFile::Material*>::iterator it = m_pModel->m_MaterialMap.find( name );
    if ( m_pModel->m_MaterialMap.end() == it) {
        // New Material created
        m_pModel->m_pCurrentMaterial = new ObjFile::Material();
        m_pModel->m_pCurrentMaterial->MaterialName.Set( name );
        m_pModel->m_MaterialLib.push_back( name );
        m_pModel->m_MaterialMap[ name ] = m_pModel->m_pCurrentMaterial;

        if (m_pModel->m_pCurrentMesh) {
            m_pModel->m_pCurrentMesh->m_uiMaterialIndex = static_cast<unsigned int>(m_pModel->m_MaterialLib.size() - 1);
        }
    } else {
        // Use older material
        m_pModel->m_pCurrentMaterial = (*it).second;
    }
}